

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O0

int Ivy_ObjLevelNew(Ivy_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  uint local_1c;
  Ivy_Obj_t *pObj_local;
  
  iVar2 = Ivy_ObjIsExor(pObj);
  pIVar3 = Ivy_ObjFanin0(pObj);
  uVar1 = *(uint *)&pIVar3->field_0x8;
  pIVar3 = Ivy_ObjFanin1(pObj);
  if (*(uint *)&pIVar3->field_0x8 >> 0xb < uVar1 >> 0xb) {
    pIVar3 = Ivy_ObjFanin0(pObj);
    local_1c = *(uint *)&pIVar3->field_0x8;
  }
  else {
    pIVar3 = Ivy_ObjFanin1(pObj);
    local_1c = *(uint *)&pIVar3->field_0x8;
  }
  local_1c = local_1c >> 0xb;
  return iVar2 + 1 + local_1c;
}

Assistant:

static inline int          Ivy_ObjLevelNew( Ivy_Obj_t * pObj )    { return 1 + Ivy_ObjIsExor(pObj) + IVY_MAX(Ivy_ObjFanin0(pObj)->Level, Ivy_ObjFanin1(pObj)->Level);       }